

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswFilter.c
# Opt level: O0

void Ssw_ManRollForward(Ssw_Man_t *p,int nFrames)

{
  Vec_Ptr_t *pVVar1;
  ulong uVar2;
  ulong uVar3;
  uint *puVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  void *pvVar8;
  Aig_Obj_t *pAVar9;
  Aig_Obj_t *pAVar10;
  int local_30;
  int local_2c;
  int i;
  int f;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  int nFrames_local;
  Ssw_Man_t *p_local;
  
  if (nFrames < 1) {
    __assert_fail("nFrames > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswFilter.c"
                  ,100,"void Ssw_ManRollForward(Ssw_Man_t *, int)");
  }
  for (local_30 = 0; iVar5 = Saig_ManRegNum(p->pAig), local_30 < iVar5; local_30 = local_30 + 1) {
    pVVar1 = p->pAig->vCos;
    iVar5 = Saig_ManPoNum(p->pAig);
    pvVar8 = Vec_PtrEntry(pVVar1,local_30 + iVar5);
    puVar4 = p->pPatWords;
    iVar5 = Saig_ManPiNum(p->pAig);
    uVar7 = Abc_InfoHasBit(puVar4,iVar5 + local_30);
    *(ulong *)((long)pvVar8 + 0x18) =
         *(ulong *)((long)pvVar8 + 0x18) & 0xffffffffffffffdf | ((ulong)uVar7 & 1) << 5;
  }
  for (local_2c = 0; local_2c < nFrames; local_2c = local_2c + 1) {
    pAVar9 = Aig_ManConst1(p->pAig);
    *(ulong *)&pAVar9->field_0x18 = *(ulong *)&pAVar9->field_0x18 & 0xffffffffffffffdf | 0x20;
    for (local_30 = 0; iVar5 = Saig_ManPiNum(p->pAig), local_30 < iVar5; local_30 = local_30 + 1) {
      pvVar8 = Vec_PtrEntry(p->pAig->vCis,local_30);
      uVar7 = Aig_ManRandom(0);
      *(ulong *)((long)pvVar8 + 0x18) =
           *(ulong *)((long)pvVar8 + 0x18) & 0xffffffffffffffdf | (ulong)(uVar7 & 1) << 5;
    }
    for (local_30 = 0; iVar5 = Saig_ManRegNum(p->pAig), local_30 < iVar5; local_30 = local_30 + 1) {
      pAVar9 = Saig_ManLi(p->pAig,local_30);
      pAVar10 = Saig_ManLo(p->pAig,local_30);
      *(ulong *)&pAVar10->field_0x18 =
           *(ulong *)&pAVar10->field_0x18 & 0xffffffffffffffdf |
           (ulong)((uint)(*(ulong *)&pAVar9->field_0x18 >> 5) & 1) << 5;
    }
    for (local_30 = 0; iVar5 = Vec_PtrSize(p->pAig->vObjs), local_30 < iVar5;
        local_30 = local_30 + 1) {
      pAVar9 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,local_30);
      if ((pAVar9 != (Aig_Obj_t *)0x0) && (iVar5 = Aig_ObjIsNode(pAVar9), iVar5 != 0)) {
        pAVar10 = Aig_ObjFanin0(pAVar9);
        uVar3 = *(ulong *)&pAVar10->field_0x18;
        uVar7 = Aig_ObjFaninC0(pAVar9);
        pAVar10 = Aig_ObjFanin1(pAVar9);
        uVar2 = *(ulong *)&pAVar10->field_0x18;
        uVar6 = Aig_ObjFaninC1(pAVar9);
        *(ulong *)&pAVar9->field_0x18 =
             *(ulong *)&pAVar9->field_0x18 & 0xffffffffffffffdf |
             ((ulong)(((uint)(uVar3 >> 5) & 1 ^ uVar7) & ((uint)(uVar2 >> 5) & 1 ^ uVar6)) & 1) << 5
        ;
      }
    }
    for (local_30 = 0; iVar5 = Vec_PtrSize(p->pAig->vCos), local_30 < iVar5; local_30 = local_30 + 1
        ) {
      pAVar9 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,local_30);
      pAVar10 = Aig_ObjFanin0(pAVar9);
      uVar3 = *(ulong *)&pAVar10->field_0x18;
      uVar7 = Aig_ObjFaninC0(pAVar9);
      *(ulong *)&pAVar9->field_0x18 =
           *(ulong *)&pAVar9->field_0x18 & 0xffffffffffffffdf |
           ((ulong)((uint)(uVar3 >> 5) & 1 ^ uVar7) & 1) << 5;
    }
  }
  for (local_30 = 0; iVar5 = Saig_ManRegNum(p->pAig), local_30 < iVar5; local_30 = local_30 + 1) {
    pVVar1 = p->pAig->vCos;
    iVar5 = Saig_ManPoNum(p->pAig);
    pvVar8 = Vec_PtrEntry(pVVar1,local_30 + iVar5);
    uVar3 = *(ulong *)((long)pvVar8 + 0x18);
    puVar4 = p->pPatWords;
    iVar5 = Saig_ManPiNum(p->pAig);
    uVar7 = Abc_InfoHasBit(puVar4,iVar5 + local_30);
    if (((uint)(uVar3 >> 5) & 1) != uVar7) {
      puVar4 = p->pPatWords;
      iVar5 = Saig_ManPiNum(p->pAig);
      Abc_InfoXorBit(puVar4,iVar5 + local_30);
    }
  }
  return;
}

Assistant:

void Ssw_ManRollForward( Ssw_Man_t * p, int nFrames )
{
    Aig_Obj_t * pObj, * pObjLi;
    int f, i;
    assert( nFrames > 0 );
    // assign register outputs
    Saig_ManForEachLi( p->pAig, pObj, i )
        pObj->fMarkB = Abc_InfoHasBit( p->pPatWords, Saig_ManPiNum(p->pAig) + i );
    // simulate the timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // set the PI simulation information
        Aig_ManConst1(p->pAig)->fMarkB = 1;
        Saig_ManForEachPi( p->pAig, pObj, i )
            pObj->fMarkB = Aig_ManRandom(0) & 1;
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObj, i )
            pObj->fMarkB = pObjLi->fMarkB;
        // simulate internal nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
            pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) )
                         & ( Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj) );
        // assign the COs
        Aig_ManForEachCo( p->pAig, pObj, i )
            pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) );
    }
    // record the new pattern
    Saig_ManForEachLi( p->pAig, pObj, i )
        if ( pObj->fMarkB ^ Abc_InfoHasBit(p->pPatWords, Saig_ManPiNum(p->pAig) + i) )
            Abc_InfoXorBit( p->pPatWords, Saig_ManPiNum(p->pAig) + i );
}